

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O3

void __thiscall kratos::SwitchStmt::set_target(SwitchStmt *this,shared_ptr<kratos::Var> *target)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar1;
  undefined8 uVar2;
  pointer ppVar3;
  uint32_t width;
  int iVar4;
  undefined1 local_48 [24];
  pointer ppStack_30;
  
  (*(((this->target_stmt_).super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr
     )->super_Stmt).super_IRNode._vptr_IRNode[0xc])();
  (this->target_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (target->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->target_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             &(target->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_refcount);
  width = (*(((target->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            super_IRNode)._vptr_IRNode[0xd])();
  iVar4 = (*(((target->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            super_IRNode)._vptr_IRNode[7])();
  Generator::get_auxiliary_var((Generator *)local_48,width,SUB41(iVar4,0));
  Var::assign((Var *)(local_48 + 0x10),(shared_ptr<kratos::Var> *)local_48._0_8_);
  ppVar3 = ppStack_30;
  uVar2 = local_48._16_8_;
  local_48._16_8_ = (pointer)0x0;
  ppStack_30 = (pointer)0x0;
  this_00 = (this->target_stmt_).super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->target_stmt_).super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)uVar2;
  (this->target_stmt_).super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppVar3;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    if (ppStack_30 != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppStack_30);
    }
  }
  if ((pointer)local_48._8_8_ != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_);
  }
  peVar1 = (this->target_stmt_).super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  (*(peVar1->super_Stmt).super_IRNode._vptr_IRNode[7])(peVar1,this);
  return;
}

Assistant:

void SwitchStmt::set_target(const std::shared_ptr<Var> &target) {
    target_stmt_->clear();
    target_ = target;
    target_stmt_ = target->generator()->get_auxiliary_var(target->width())->assign(target);
    target_stmt_->set_parent(this);
}